

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

int __thiscall QSliderPrivate::init(QSliderPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QSlider *q;
  QSizePolicy sp;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffc8;
  FocusPolicy in_stack_ffffffffffffffcc;
  QWidget *this_01;
  QSliderPrivate *pQVar3;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this;
  this_00 = (QWidget *)q_func(this);
  policy.data = (quint32)((ulong)pQVar3 >> 0x20);
  this->pressedControl = SC_None;
  this->tickInterval = 0;
  this->tickPosition = NoTicks;
  this->hoverControl = SC_None;
  this_01 = this_00;
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x31,0,this_01);
  QWidget::setFocusPolicy(this_00,in_stack_ffffffffffffffcc);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_01,(Policy)((ulong)this >> 0x20),(Policy)this,
             (ControlType)((ulong)this_00 >> 0x20));
  if ((this->super_QAbstractSliderPrivate).orientation == Vertical) {
    QSizePolicy::transpose((QSizePolicy *)this_00);
  }
  QWidget::setSizePolicy(this_01,(QSizePolicy)policy);
  QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
  resetLayoutItemMargins(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSliderPrivate::init()
{
    Q_Q(QSlider);
    pressedControl = QStyle::SC_None;
    tickInterval = 0;
    tickPosition = QSlider::NoTicks;
    hoverControl = QStyle::SC_None;
    q->setFocusPolicy(Qt::FocusPolicy(q->style()->styleHint(QStyle::SH_Button_FocusPolicy, nullptr, q)));
    QSizePolicy sp(QSizePolicy::Expanding, QSizePolicy::Fixed, QSizePolicy::Slider);
    if (orientation == Qt::Vertical)
        sp.transpose();
    q->setSizePolicy(sp);
    q->setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    resetLayoutItemMargins();
}